

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O1

NpyArray * cnpy::npz_load(NpyArray *__return_storage_ptr__,string *fname,string *varname)

{
  ushort uVar1;
  short sVar2;
  uint uncompr_bytes;
  uint32_t compr_bytes;
  int iVar3;
  FILE *__stream;
  undefined8 *__ptr;
  size_t sVar4;
  runtime_error *prVar5;
  long *plVar6;
  size_type *psVar7;
  value_type *__val;
  string vname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  NpyArray *local_88;
  string *local_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88 = __return_storage_ptr__;
  local_80 = varname;
  local_78 = fname;
  __stream = fopen((fname->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"npz_load: Unable to open file ",local_78);
    std::runtime_error::runtime_error(prVar5,(string *)&local_a8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  do {
    __ptr = (undefined8 *)operator_new(0x1e);
    *__ptr = 0;
    __ptr[1] = 0;
    *(undefined8 *)((long)__ptr + 0xe) = 0;
    *(undefined8 *)((long)__ptr + 0x16) = 0;
    sVar4 = fread(__ptr,1,0x1e,__stream);
    if (sVar4 != 0x1e) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"npz_load: failed fread");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = 3;
    if ((*(char *)((long)__ptr + 2) == '\x03') && (*(char *)((long)__ptr + 3) == '\x04')) {
      uVar1 = *(ushort *)((long)__ptr + 0x1a);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a8,(char)uVar1);
      sVar4 = fread(local_a8._M_dataplus._M_p,1,(ulong)uVar1,__stream);
      if (sVar4 != uVar1) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"npz_load: failed fread");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_a8._M_dataplus._M_p[local_a8._M_string_length - 4] = '\0';
      local_a8._M_string_length = local_a8._M_string_length - 4;
      fseek(__stream,(ulong)*(ushort *)((long)__ptr + 0x1c),1);
      uncompr_bytes = *(uint *)((long)__ptr + 0x16);
      if (local_a8._M_string_length == local_80->_M_string_length) {
        sVar2 = *(short *)(__ptr + 1);
        compr_bytes = *(uint32_t *)((long)__ptr + 0x12);
        if (local_a8._M_string_length != 0) {
          iVar3 = bcmp(local_a8._M_dataplus._M_p,(local_80->_M_dataplus)._M_p,
                       local_a8._M_string_length);
          if (iVar3 != 0) goto LAB_0011701c;
        }
        if (sVar2 == 0) {
          load_the_npy_file(local_88,(FILE *)__stream);
        }
        else {
          load_the_npz_array(local_88,(FILE *)__stream,compr_bytes,uncompr_bytes);
        }
        fclose(__stream);
        iVar3 = 1;
      }
      else {
LAB_0011701c:
        fseek(__stream,(ulong)uncompr_bytes,1);
        iVar3 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
    operator_delete(__ptr);
    if (iVar3 != 0) {
      if (iVar3 != 3) {
        return local_88;
      }
      fclose(__stream);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"npz_load: Variable name ",local_80);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)*plVar6;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar7) {
        local_70.field_2._M_allocated_capacity = *psVar7;
        local_70.field_2._8_8_ = plVar6[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar7;
      }
      local_70._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::operator+(&local_a8,&local_70,local_78);
      std::runtime_error::runtime_error(prVar5,(string *)&local_a8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  } while( true );
}

Assistant:

cnpy::NpyArray cnpy::npz_load(std::string fname, std::string varname) {
    FILE* fp = fopen(fname.c_str(),"rb");

    if(!fp) throw std::runtime_error("npz_load: Unable to open file "+fname);

    while(1) {
        std::vector<char> local_header(30);
        size_t header_res = fread(&local_header[0],sizeof(char),30,fp);
        if(header_res != 30)
            throw std::runtime_error("npz_load: failed fread");

        //if we've reached the global header, stop reading
        if(local_header[2] != 0x03 || local_header[3] != 0x04) break;

        //read in the variable name
        uint16_t name_len = *(uint16_t*) &local_header[26];
        std::string vname(name_len,' ');
        size_t vname_res = fread(&vname[0],sizeof(char),name_len,fp);      
        if(vname_res != name_len)
            throw std::runtime_error("npz_load: failed fread");
        vname.erase(vname.end()-4,vname.end()); //erase the lagging .npy

        //read in the extra field
        uint16_t extra_field_len = *(uint16_t*) &local_header[28];
        fseek(fp,extra_field_len,SEEK_CUR); //skip past the extra field
        
        uint16_t compr_method = *reinterpret_cast<uint16_t*>(&local_header[0]+8);
        uint32_t compr_bytes = *reinterpret_cast<uint32_t*>(&local_header[0]+18);
        uint32_t uncompr_bytes = *reinterpret_cast<uint32_t*>(&local_header[0]+22);

        if(vname == varname) {
            NpyArray array  = (compr_method == 0) ? load_the_npy_file(fp) : load_the_npz_array(fp,compr_bytes,uncompr_bytes);
            fclose(fp);
            return array;
        }
        else {
            //skip past the data
            uint32_t size = *(uint32_t*) &local_header[22];
            fseek(fp,size,SEEK_CUR);
        }
    }

    fclose(fp);

    //if we get here, we haven't found the variable in the file
    throw std::runtime_error("npz_load: Variable name "+varname+" not found in "+fname);
}